

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

LayerParameter *
google::protobuf::internal::GenericTypeHandler<caffe::LayerParameter>::New(Arena *arena)

{
  Arena *arena_local;
  LayerParameter *local_28;
  LayerParameter *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (LayerParameter *)operator_new(600);
    caffe::LayerParameter::LayerParameter(local_28);
  }
  else {
    local_28 = (LayerParameter *)
               Arena::AllocateAligned(arena,(type_info *)&caffe::LayerParameter::typeinfo,600);
    caffe::LayerParameter::LayerParameter(local_28);
    Arena::AddListNode(arena,local_28,arena_destruct_object<caffe::LayerParameter>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }